

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_bounds ZSTD_cParam_getBounds(ZSTD_cParameter param)

{
  ZSTD_bounds ZVar1;
  int iVar2;
  int iVar3;
  ZSTD_bounds bounds;
  size_t sStack_18;
  ZSTD_cParameter param_local;
  ZSTD_bounds boundError;
  
  if (param == ZSTD_c_experimentalParam2) {
    sStack_18 = 0;
    boundError.error = 0x100000000;
  }
  else if (param == ZSTD_c_compressionLevel) {
    iVar2 = ZSTD_minCLevel();
    iVar3 = ZSTD_maxCLevel();
    bounds.error = CONCAT44(iVar3,iVar2);
    sStack_18 = 0;
    boundError.error = bounds.error;
  }
  else if (param == ZSTD_c_windowLog) {
    sStack_18 = 0;
    boundError.error = 0x1f0000000a;
  }
  else if (param == ZSTD_c_hashLog) {
    sStack_18 = 0;
    boundError.error = 0x1e00000006;
  }
  else if (param == ZSTD_c_chainLog) {
    sStack_18 = 0;
    boundError.error = 0x1e00000006;
  }
  else if (param == ZSTD_c_searchLog) {
    sStack_18 = 0;
    boundError.error = 0x1e00000001;
  }
  else if (param == ZSTD_c_minMatch) {
    sStack_18 = 0;
    boundError.error = 0x700000003;
  }
  else if (param == ZSTD_c_targetLength) {
    sStack_18 = 0;
    boundError.error = 0x2000000000000;
  }
  else if (param == ZSTD_c_strategy) {
    sStack_18 = 0;
    boundError.error = 0x900000001;
  }
  else if (param == ZSTD_c_enableLongDistanceMatching) {
    sStack_18 = 0;
    boundError.error = 0x100000000;
  }
  else if (param == ZSTD_c_ldmHashLog) {
    sStack_18 = 0;
    boundError.error = 0x1e00000006;
  }
  else if (param == ZSTD_c_ldmMinMatch) {
    sStack_18 = 0;
    boundError.error = 0x100000000004;
  }
  else if (param == ZSTD_c_ldmBucketSizeLog) {
    sStack_18 = 0;
    boundError.error = 0x800000001;
  }
  else if (param == ZSTD_c_ldmHashRateLog) {
    sStack_18 = 0;
    boundError.error = 0x1900000000;
  }
  else if (param == ZSTD_c_contentSizeFlag) {
    sStack_18 = 0;
    boundError.error = 0x100000000;
  }
  else if (param == ZSTD_c_checksumFlag) {
    sStack_18 = 0;
    boundError.error = 0x100000000;
  }
  else if (param == ZSTD_c_dictIDFlag) {
    sStack_18 = 0;
    boundError.error = 0x100000000;
  }
  else if (param == ZSTD_c_nbWorkers) {
    sStack_18 = 0;
    boundError.error = 0;
  }
  else if (param == ZSTD_c_jobSize) {
    sStack_18 = 0;
    boundError.error = 0;
  }
  else if (param == ZSTD_c_overlapLog) {
    sStack_18 = 0;
    boundError.error = 0x900000000;
  }
  else if (param == ZSTD_c_experimentalParam1) {
    sStack_18 = 0;
    boundError.error = 0x100000000;
  }
  else if (param == ZSTD_c_experimentalParam3) {
    sStack_18 = 0;
    boundError.error = 0x100000000;
  }
  else if (param == ZSTD_c_experimentalParam4) {
    sStack_18 = 0;
    boundError.error = 0x200000000;
  }
  else {
    sStack_18 = 0xffffffffffffffd8;
    boundError.error = 0;
  }
  ZVar1.lowerBound = (undefined4)boundError.error;
  ZVar1.upperBound = boundError.error._4_4_;
  ZVar1.error = sStack_18;
  return ZVar1;
}

Assistant:

ZSTD_bounds ZSTD_cParam_getBounds(ZSTD_cParameter param)
{
    ZSTD_bounds bounds = { 0, 0, 0 };

    switch(param)
    {
    case ZSTD_c_compressionLevel:
        bounds.lowerBound = ZSTD_minCLevel();
        bounds.upperBound = ZSTD_maxCLevel();
        return bounds;

    case ZSTD_c_windowLog:
        bounds.lowerBound = ZSTD_WINDOWLOG_MIN;
        bounds.upperBound = ZSTD_WINDOWLOG_MAX;
        return bounds;

    case ZSTD_c_hashLog:
        bounds.lowerBound = ZSTD_HASHLOG_MIN;
        bounds.upperBound = ZSTD_HASHLOG_MAX;
        return bounds;

    case ZSTD_c_chainLog:
        bounds.lowerBound = ZSTD_CHAINLOG_MIN;
        bounds.upperBound = ZSTD_CHAINLOG_MAX;
        return bounds;

    case ZSTD_c_searchLog:
        bounds.lowerBound = ZSTD_SEARCHLOG_MIN;
        bounds.upperBound = ZSTD_SEARCHLOG_MAX;
        return bounds;

    case ZSTD_c_minMatch:
        bounds.lowerBound = ZSTD_MINMATCH_MIN;
        bounds.upperBound = ZSTD_MINMATCH_MAX;
        return bounds;

    case ZSTD_c_targetLength:
        bounds.lowerBound = ZSTD_TARGETLENGTH_MIN;
        bounds.upperBound = ZSTD_TARGETLENGTH_MAX;
        return bounds;

    case ZSTD_c_strategy:
        bounds.lowerBound = ZSTD_STRATEGY_MIN;
        bounds.upperBound = ZSTD_STRATEGY_MAX;
        return bounds;

    case ZSTD_c_contentSizeFlag:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_checksumFlag:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_dictIDFlag:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_nbWorkers:
        bounds.lowerBound = 0;
#ifdef ZSTD_MULTITHREAD
        bounds.upperBound = ZSTDMT_NBWORKERS_MAX;
#else
        bounds.upperBound = 0;
#endif
        return bounds;

    case ZSTD_c_jobSize:
        bounds.lowerBound = 0;
#ifdef ZSTD_MULTITHREAD
        bounds.upperBound = ZSTDMT_JOBSIZE_MAX;
#else
        bounds.upperBound = 0;
#endif
        return bounds;

    case ZSTD_c_overlapLog:
        bounds.lowerBound = ZSTD_OVERLAPLOG_MIN;
        bounds.upperBound = ZSTD_OVERLAPLOG_MAX;
        return bounds;

    case ZSTD_c_enableLongDistanceMatching:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_ldmHashLog:
        bounds.lowerBound = ZSTD_LDM_HASHLOG_MIN;
        bounds.upperBound = ZSTD_LDM_HASHLOG_MAX;
        return bounds;

    case ZSTD_c_ldmMinMatch:
        bounds.lowerBound = ZSTD_LDM_MINMATCH_MIN;
        bounds.upperBound = ZSTD_LDM_MINMATCH_MAX;
        return bounds;

    case ZSTD_c_ldmBucketSizeLog:
        bounds.lowerBound = ZSTD_LDM_BUCKETSIZELOG_MIN;
        bounds.upperBound = ZSTD_LDM_BUCKETSIZELOG_MAX;
        return bounds;

    case ZSTD_c_ldmHashRateLog:
        bounds.lowerBound = ZSTD_LDM_HASHRATELOG_MIN;
        bounds.upperBound = ZSTD_LDM_HASHRATELOG_MAX;
        return bounds;

    /* experimental parameters */
    case ZSTD_c_rsyncable:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_forceMaxWindow :
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_format:
        ZSTD_STATIC_ASSERT(ZSTD_f_zstd1 < ZSTD_f_zstd1_magicless);
        bounds.lowerBound = ZSTD_f_zstd1;
        bounds.upperBound = ZSTD_f_zstd1_magicless;   /* note : how to ensure at compile time that this is the highest value enum ? */
        return bounds;

    case ZSTD_c_forceAttachDict:
        ZSTD_STATIC_ASSERT(ZSTD_dictDefaultAttach < ZSTD_dictForceCopy);
        bounds.lowerBound = ZSTD_dictDefaultAttach;
        bounds.upperBound = ZSTD_dictForceCopy;       /* note : how to ensure at compile time that this is the highest value enum ? */
        return bounds;

    default:
        {   ZSTD_bounds const boundError = { ERROR(parameter_unsupported), 0, 0 };
            return boundError;
        }
    }
}